

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

PAL_ERROR MAPmmapAndRecord(IPalObject *pMappingObject,void *pPEBaseAddress,void *addr,size_t len,
                          int prot,int flags,int fd,off_t offset,LPVOID *ppvBaseAddress)

{
  int iVar1;
  undefined1 *addr_00;
  int *piVar2;
  LPVOID pvBaseAddress;
  PAL_ERROR palError;
  int flags_local;
  int prot_local;
  size_t len_local;
  void *addr_local;
  void *pPEBaseAddress_local;
  IPalObject *pMappingObject_local;
  
  if (pPEBaseAddress == (void *)0x0) {
    fprintf(_stderr,"] %s %s:%d","MAPmmapAndRecord",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x8a6);
    fprintf(_stderr,"Expression: pPEBaseAddress != NULL\n");
  }
  addr_00 = (undefined1 *)mmap64(addr,len,prot,flags,fd,offset);
  if (addr_00 == &DAT_ffffffffffffffff) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    piVar2 = __errno_location();
    strerror(*piVar2);
    pvBaseAddress._4_4_ = FILEGetLastErrorFromErrno();
  }
  else {
    pvBaseAddress._4_4_ = MAPRecordMapping(pMappingObject,pPEBaseAddress,addr_00,len,prot);
    if (pvBaseAddress._4_4_ == 0) {
      *ppvBaseAddress = addr_00;
    }
    else {
      iVar1 = munmap(addr_00,len);
      if ((iVar1 == -1) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
        abort();
      }
    }
  }
  return pvBaseAddress._4_4_;
}

Assistant:

static PAL_ERROR
MAPmmapAndRecord(
    IPalObject *pMappingObject,
    void *pPEBaseAddress,
    void *addr,
    size_t len,
    int prot,
    int flags,
    int fd,
    off_t offset,
    LPVOID *ppvBaseAddress
    )
{
    _ASSERTE(pPEBaseAddress != NULL);

    PAL_ERROR palError = NO_ERROR;
    LPVOID pvBaseAddress = NULL;

    pvBaseAddress = mmap(addr, len, prot, flags, fd, offset);
    if (MAP_FAILED == pvBaseAddress)
    {
        ERROR_(LOADER)( "mmap failed with code %d: %s.\n", errno, strerror( errno ) );
        palError = FILEGetLastErrorFromErrno();
    }
    else
    {
        palError = MAPRecordMapping(pMappingObject, pPEBaseAddress, pvBaseAddress, len, prot);
        if (NO_ERROR != palError)
        {
            if (-1 == munmap(pvBaseAddress, len))
            {
                ERROR_(LOADER)("Unable to unmap the file. Expect trouble.\n");
            }
        }
        else
        {
            *ppvBaseAddress = pvBaseAddress;
        }
    }

    return palError;
}